

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# were.c
# Opt level: O0

void were_change(monst *mon)

{
  byte bVar1;
  int iVar2;
  int local_1c;
  char *local_18;
  char *howler;
  monst *mon_local;
  
  if ((mon->data->mflags2 & 4) == 0) {
    return;
  }
  if ((mon->data->mflags2 & 8) == 0) {
    iVar2 = rn2(0x1e);
    if (((iVar2 != 0) && (u.uprops[0x17].intrinsic == 0)) && (u.uprops[0x17].extrinsic == 0)) {
      return;
    }
    new_were(mon);
    return;
  }
  if (u.uprops[0x17].intrinsic != 0) {
    return;
  }
  if (u.uprops[0x17].extrinsic != 0) {
    return;
  }
  iVar2 = night();
  if (iVar2 == 0) {
    local_1c = 0x32;
    if (flags.moonphase == 4) {
      local_1c = 10;
    }
  }
  else {
    local_1c = 0x1e;
    if (flags.moonphase == 4) {
      local_1c = 3;
    }
  }
  iVar2 = rn2(local_1c);
  if (iVar2 != 0) {
    return;
  }
  new_were(mon);
  if (flags.soundok == '\0') {
    return;
  }
  if (mon->wormno == '\0') {
    if ((viz_array[mon->my][mon->mx] & 2U) == 0) {
      if ((((((u.uprops[0x1e].intrinsic != 0) ||
             ((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)))) ||
            (((youmonst.data)->mflags1 & 0x1000) != 0)) &&
           ((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')))) ||
          ((u.uprops[0x40].intrinsic == 0 &&
           ((u.uprops[0x40].extrinsic == 0 && (((youmonst.data)->mflags3 & 0x100) == 0)))))) ||
         ((mon->data->mflags3 & 0x200) == 0)) goto LAB_0033a090;
      bVar1 = viz_array[mon->my][mon->mx] & 1;
      goto joined_r0x0033a001;
    }
  }
  else {
    bVar1 = worm_known(level,mon);
joined_r0x0033a001:
    if (bVar1 == 0) goto LAB_0033a090;
  }
  if ((((((*(uint *)&mon->field_0x60 >> 1 & 1) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
       (u.uprops[0xc].extrinsic != 0)) || (((youmonst.data)->mflags1 & 0x1000000) != 0)) &&
     ((((*(uint *)&mon->field_0x60 >> 7 & 1) == 0 && ((*(uint *)&mon->field_0x60 >> 9 & 1) == 0)) &&
      (((byte)u._1052_1_ >> 5 & 1) == 0)))) {
    return;
  }
LAB_0033a090:
  if (mon->mnum == 0x11) {
    local_18 = "jackal";
  }
  else if (mon->mnum == 0x17) {
    local_18 = "wolf";
  }
  else {
    local_18 = (char *)0x0;
  }
  if (local_18 != (char *)0x0) {
    You_hear("a %s howling at the moon.",local_18);
  }
  return;
}

Assistant:

void were_change(struct monst *mon)
{
	if (!is_were(mon->data))
	    return;

	if (is_human(mon->data)) {
	    if (!Protection_from_shape_changers &&
		!rn2(night() ? (flags.moonphase == FULL_MOON ?  3 : 30)
			     : (flags.moonphase == FULL_MOON ? 10 : 50))) {
		new_were(mon);		/* change into animal form */
		if (flags.soundok && !canseemon(level, mon)) {
		    const char *howler;

		    switch (mon->mnum) {
		    case PM_WEREWOLF:	howler = "wolf";    break;
		    case PM_WEREJACKAL: howler = "jackal";  break;
		    default:		howler = NULL; break;
		    }
		    if (howler)
			You_hear("a %s howling at the moon.", howler);
		}
	    }
	} else if (!rn2(30) || Protection_from_shape_changers) {
	    new_were(mon);		/* change back into human form */
	}
}